

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct32_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i bf1 [32];
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar34 = (long)bit * 0x100;
  iVar25 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x248);
  iVar26 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x228);
  iVar27 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x230);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x240);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x200);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x180);
  iVar38 = -iVar4;
  iVar30 = -iVar5;
  iVar39 = -iVar2;
  iVar35 = -iVar3;
  iVar36 = 1 << ((char)bit - 1U & 0x1f);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1e0);
  iVar31 = -iVar6;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x220);
  iVar32 = -iVar7;
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1a0);
  iVar33 = -iVar8;
  iVar37 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_4a0 = 0x8000;
  if (0xf < iVar37) {
    local_4a0 = 1 << ((char)iVar37 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 600);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar63._16_4_ = uVar1;
  auVar63._20_4_ = uVar1;
  auVar63._24_4_ = uVar1;
  auVar63._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x198);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar64._16_4_ = uVar1;
  auVar64._20_4_ = uVar1;
  auVar64._24_4_ = uVar1;
  auVar64._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x238);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  local_480 = -local_4a0;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x188);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  local_4a0 = local_4a0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x168);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar61._4_4_ = iVar36;
  auVar61._0_4_ = iVar36;
  auVar61._8_4_ = iVar36;
  auVar61._12_4_ = iVar36;
  auVar61._16_4_ = iVar36;
  auVar61._20_4_ = iVar36;
  auVar61._24_4_ = iVar36;
  auVar61._28_4_ = iVar36;
  auVar46 = vpmulld_avx2((undefined1  [32])in[1],auVar46);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar9 = vpsrad_avx2(auVar46,ZEXT416((uint)bit));
  auVar45._4_4_ = iVar26;
  auVar45._0_4_ = iVar26;
  auVar45._8_4_ = iVar26;
  auVar45._12_4_ = iVar26;
  auVar45._16_4_ = iVar26;
  auVar45._20_4_ = iVar26;
  auVar45._24_4_ = iVar26;
  auVar45._28_4_ = iVar26;
  auVar46 = vpmulld_avx2((undefined1  [32])in[1],auVar63);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar63 = vpsrad_avx2(auVar46,ZEXT416((uint)bit));
  auVar46 = vpmulld_avx2((undefined1  [32])in[7],auVar45);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar43 = ZEXT416((uint)bit);
  auVar10 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2((undefined1  [32])in[7],auVar64);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar11 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2((undefined1  [32])in[5],auVar65);
  auVar45 = vpmulld_avx2((undefined1  [32])in[5],auVar62);
  auVar66._4_4_ = iVar25;
  auVar66._0_4_ = iVar25;
  auVar66._8_4_ = iVar25;
  auVar66._12_4_ = iVar25;
  auVar66._16_4_ = iVar25;
  auVar66._20_4_ = iVar25;
  auVar66._24_4_ = iVar25;
  auVar66._28_4_ = iVar25;
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar62 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar61,auVar45);
  auVar64 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2((undefined1  [32])in[3],auVar66);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x178);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar67._16_4_ = uVar1;
  auVar67._20_4_ = uVar1;
  auVar67._24_4_ = uVar1;
  auVar67._28_4_ = uVar1;
  auVar45 = vpmulld_avx2((undefined1  [32])in[3],auVar67);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar43 = ZEXT416((uint)bit);
  auVar65 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar61,auVar45);
  auVar66 = vpsrad_avx2(auVar46,auVar43);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x170);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar46 = vpmulld_avx2((undefined1  [32])in[2],auVar47);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x250);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  auVar45 = vpmulld_avx2((undefined1  [32])in[2],auVar52);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar12 = vpsrad_avx2(auVar46,auVar43);
  auVar48._4_4_ = iVar27;
  auVar48._0_4_ = iVar27;
  auVar48._8_4_ = iVar27;
  auVar48._12_4_ = iVar27;
  auVar48._16_4_ = iVar27;
  auVar48._20_4_ = iVar27;
  auVar48._24_4_ = iVar27;
  auVar48._28_4_ = iVar27;
  auVar46 = vpaddd_avx2(auVar61,auVar45);
  auVar67 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2((undefined1  [32])in[6],auVar48);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 400);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  auVar58._16_4_ = uVar1;
  auVar58._20_4_ = uVar1;
  auVar58._24_4_ = uVar1;
  auVar58._28_4_ = uVar1;
  auVar45 = vpmulld_avx2((undefined1  [32])in[6],auVar58);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar13 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar61,auVar45);
  auVar14 = vpsrad_avx2(auVar46,auVar43);
  auVar59._4_4_ = iVar2;
  auVar59._0_4_ = iVar2;
  auVar59._8_4_ = iVar2;
  auVar59._12_4_ = iVar2;
  auVar59._16_4_ = iVar2;
  auVar59._20_4_ = iVar2;
  auVar59._24_4_ = iVar2;
  auVar59._28_4_ = iVar2;
  auVar50._4_4_ = iVar5;
  auVar50._0_4_ = iVar5;
  auVar50._8_4_ = iVar5;
  auVar50._12_4_ = iVar5;
  auVar50._16_4_ = iVar5;
  auVar50._20_4_ = iVar5;
  auVar50._24_4_ = iVar5;
  auVar50._28_4_ = iVar5;
  auVar46 = vpmulld_avx2((undefined1  [32])in[4],auVar50);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar15 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2((undefined1  [32])in[4],auVar59);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar16 = vpsrad_avx2(auVar46,auVar43);
  auVar40._4_4_ = iVar30;
  auVar40._0_4_ = iVar30;
  auVar40._8_4_ = iVar30;
  auVar40._12_4_ = iVar30;
  auVar40._16_4_ = iVar30;
  auVar40._20_4_ = iVar30;
  auVar40._24_4_ = iVar30;
  auVar40._28_4_ = iVar30;
  auVar46 = vpmulld_avx2(auVar63,auVar40);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar9,auVar59);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar47 = vpmulld_avx2(auVar9,auVar50);
  auVar45 = vpmulld_avx2(auVar63,auVar59);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  auVar45 = vpaddd_avx2(auVar45,auVar47);
  auVar53._4_4_ = iVar39;
  auVar53._0_4_ = iVar39;
  auVar53._8_4_ = iVar39;
  auVar53._12_4_ = iVar39;
  auVar53._16_4_ = iVar39;
  auVar53._20_4_ = iVar39;
  auVar53._24_4_ = iVar39;
  auVar53._28_4_ = iVar39;
  auVar48 = vpmulld_avx2(auVar10,auVar53);
  auVar47 = vpmulld_avx2(auVar11,auVar40);
  auVar47 = vpaddd_avx2(auVar61,auVar47);
  auVar47 = vpaddd_avx2(auVar48,auVar47);
  auVar48 = vpmulld_avx2(auVar10,auVar40);
  auVar56._4_4_ = iVar3;
  auVar56._0_4_ = iVar3;
  auVar56._8_4_ = iVar3;
  auVar56._12_4_ = iVar3;
  auVar56._16_4_ = iVar3;
  auVar56._20_4_ = iVar3;
  auVar56._24_4_ = iVar3;
  auVar56._28_4_ = iVar3;
  auVar40 = vpmulld_avx2(auVar11,auVar59);
  auVar43 = ZEXT416((uint)bit);
  auVar50 = vpsrad_avx2(auVar46,auVar43);
  auVar58 = vpsrad_avx2(auVar45,auVar43);
  auVar60._4_4_ = iVar38;
  auVar60._0_4_ = iVar38;
  auVar60._8_4_ = iVar38;
  auVar60._12_4_ = iVar38;
  auVar60._16_4_ = iVar38;
  auVar60._20_4_ = iVar38;
  auVar60._24_4_ = iVar38;
  auVar60._28_4_ = iVar38;
  auVar52 = vpsrad_avx2(auVar47,auVar43);
  auVar46 = vpaddd_avx2(auVar61,auVar40);
  auVar46 = vpaddd_avx2(auVar48,auVar46);
  auVar40 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar64,auVar60);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar62,auVar56);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar51._4_4_ = iVar4;
  auVar51._0_4_ = iVar4;
  auVar51._8_4_ = iVar4;
  auVar51._12_4_ = iVar4;
  auVar51._16_4_ = iVar4;
  auVar51._20_4_ = iVar4;
  auVar51._24_4_ = iVar4;
  auVar51._28_4_ = iVar4;
  auVar47 = vpmulld_avx2(auVar62,auVar51);
  auVar45 = vpmulld_avx2(auVar64,auVar56);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  auVar45 = vpaddd_avx2(auVar45,auVar47);
  auVar51 = vpsrad_avx2(auVar46,auVar43);
  auVar49._4_4_ = iVar35;
  auVar49._0_4_ = iVar35;
  auVar49._8_4_ = iVar35;
  auVar49._12_4_ = iVar35;
  auVar49._16_4_ = iVar35;
  auVar49._20_4_ = iVar35;
  auVar49._24_4_ = iVar35;
  auVar49._28_4_ = iVar35;
  auVar53 = vpsrad_avx2(auVar45,auVar43);
  auVar46 = vpmulld_avx2(auVar65,auVar49);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar66,auVar60);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpmulld_avx2(auVar65,auVar60);
  auVar47 = vpmulld_avx2(auVar66,auVar56);
  auVar54._4_4_ = iVar6;
  auVar54._0_4_ = iVar6;
  auVar54._8_4_ = iVar6;
  auVar54._12_4_ = iVar6;
  auVar54._16_4_ = iVar6;
  auVar54._20_4_ = iVar6;
  auVar54._24_4_ = iVar6;
  auVar54._28_4_ = iVar6;
  auVar49 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar61,auVar47);
  auVar46 = vpaddd_avx2(auVar45,auVar46);
  auVar56 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar54,(undefined1  [32])*in);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar17 = vpsrad_avx2(auVar46,auVar43);
  auVar57._4_4_ = iVar7;
  auVar57._0_4_ = iVar7;
  auVar57._8_4_ = iVar7;
  auVar57._12_4_ = iVar7;
  auVar57._16_4_ = iVar7;
  auVar57._20_4_ = iVar7;
  auVar57._24_4_ = iVar7;
  auVar57._28_4_ = iVar7;
  auVar55._4_4_ = iVar33;
  auVar55._0_4_ = iVar33;
  auVar55._8_4_ = iVar33;
  auVar55._12_4_ = iVar33;
  auVar55._16_4_ = iVar33;
  auVar55._20_4_ = iVar33;
  auVar55._24_4_ = iVar33;
  auVar55._28_4_ = iVar33;
  auVar46 = vpmulld_avx2(auVar12,auVar57);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar67,auVar55);
  auVar46 = vpaddd_avx2(auVar45,auVar46);
  auVar41._4_4_ = iVar8;
  auVar41._0_4_ = iVar8;
  auVar41._8_4_ = iVar8;
  auVar41._12_4_ = iVar8;
  auVar41._16_4_ = iVar8;
  auVar41._20_4_ = iVar8;
  auVar41._24_4_ = iVar8;
  auVar41._28_4_ = iVar8;
  auVar45 = vpmulld_avx2(auVar67,auVar57);
  auVar47 = vpmulld_avx2(auVar12,auVar41);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  auVar45 = vpaddd_avx2(auVar45,auVar47);
  auVar42._4_4_ = iVar32;
  auVar42._0_4_ = iVar32;
  auVar42._8_4_ = iVar32;
  auVar42._12_4_ = iVar32;
  auVar42._16_4_ = iVar32;
  auVar42._20_4_ = iVar32;
  auVar42._24_4_ = iVar32;
  auVar42._28_4_ = iVar32;
  auVar59 = vpsrad_avx2(auVar46,auVar43);
  auVar60 = vpsrad_avx2(auVar45,auVar43);
  auVar46 = vpmulld_avx2(auVar13,auVar42);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar14,auVar55);
  auVar46 = vpaddd_avx2(auVar45,auVar46);
  auVar47 = vpmulld_avx2(auVar13,auVar55);
  auVar45 = vpmulld_avx2(auVar14,auVar57);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  auVar45 = vpaddd_avx2(auVar47,auVar45);
  auVar47 = vpsrad_avx2(auVar46,auVar43);
  auVar18 = vpsrad_avx2(auVar45,auVar43);
  auVar46 = vpaddd_avx2(auVar10,auVar63);
  auVar48 = vpsubd_avx2(auVar63,auVar10);
  auVar45 = vpaddd_avx2(auVar52,auVar50);
  auVar10 = vpsubd_avx2(auVar50,auVar52);
  auVar29._4_4_ = local_480;
  auVar29._0_4_ = local_480;
  auVar29._8_4_ = local_480;
  auVar29._12_4_ = local_480;
  auVar29._16_4_ = local_480;
  auVar29._20_4_ = local_480;
  auVar29._24_4_ = local_480;
  auVar29._28_4_ = local_480;
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar28._4_4_ = local_4a0;
  auVar28._0_4_ = local_4a0;
  auVar28._8_4_ = local_4a0;
  auVar28._12_4_ = local_4a0;
  auVar28._16_4_ = local_4a0;
  auVar28._20_4_ = local_4a0;
  auVar28._24_4_ = local_4a0;
  auVar28._28_4_ = local_4a0;
  auVar50 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar48,auVar29);
  auVar63 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar52 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar10,auVar29);
  auVar48 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar64,auVar65);
  auVar10 = vpsubd_avx2(auVar65,auVar64);
  auVar45 = vpaddd_avx2(auVar49,auVar51);
  auVar64 = vpsubd_avx2(auVar49,auVar51);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar65 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar10,auVar29);
  auVar10 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar51 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar64,auVar29);
  auVar64 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar62,auVar66);
  auVar62 = vpsubd_avx2(auVar66,auVar62);
  auVar45 = vpaddd_avx2(auVar53,auVar56);
  auVar49 = vpsubd_avx2(auVar56,auVar53);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar66 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar62,auVar29);
  auVar62 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar53 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar49,auVar29);
  auVar49 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar11,auVar9);
  auVar9 = vpsubd_avx2(auVar9,auVar11);
  auVar45 = vpaddd_avx2(auVar40,auVar58);
  auVar40 = vpsubd_avx2(auVar58,auVar40);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar11 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar9,auVar29);
  auVar9 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar58 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar40,auVar29);
  auVar40 = vpminsd_avx2(auVar46,auVar28);
  auVar44._4_4_ = iVar31;
  auVar44._0_4_ = iVar31;
  auVar44._8_4_ = iVar31;
  auVar44._12_4_ = iVar31;
  auVar44._16_4_ = iVar31;
  auVar44._20_4_ = iVar31;
  auVar44._24_4_ = iVar31;
  auVar44._28_4_ = iVar31;
  auVar46 = vpmulld_avx2(auVar15,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar45 = vpmulld_avx2(auVar16,auVar44);
  auVar46 = vpaddd_avx2(auVar45,auVar46);
  auVar45 = vpaddd_avx2(auVar16,auVar15);
  auVar19 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar45,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar20 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar13,auVar67);
  auVar13 = vpsubd_avx2(auVar67,auVar13);
  auVar45 = vpaddd_avx2(auVar47,auVar59);
  auVar47 = vpsubd_avx2(auVar59,auVar47);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar67 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar13,auVar29);
  auVar13 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar56 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar47,auVar29);
  auVar59 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar12,auVar14);
  auVar14 = vpsubd_avx2(auVar12,auVar14);
  auVar45 = vpaddd_avx2(auVar18,auVar60);
  auVar60 = vpsubd_avx2(auVar60,auVar18);
  auVar47 = vpmulld_avx2(auVar48,auVar55);
  auVar47 = vpaddd_avx2(auVar61,auVar47);
  auVar12 = vpmulld_avx2(auVar40,auVar57);
  auVar47 = vpaddd_avx2(auVar12,auVar47);
  auVar48 = vpmulld_avx2(auVar48,auVar57);
  auVar40 = vpmulld_avx2(auVar40,auVar41);
  auVar48 = vpaddd_avx2(auVar61,auVar48);
  auVar48 = vpaddd_avx2(auVar48,auVar40);
  auVar40 = vpmulld_avx2(auVar9,auVar57);
  auVar40 = vpaddd_avx2(auVar61,auVar40);
  auVar12 = vpmulld_avx2(auVar63,auVar55);
  auVar40 = vpaddd_avx2(auVar12,auVar40);
  auVar9 = vpmulld_avx2(auVar9,auVar41);
  auVar63 = vpmulld_avx2(auVar63,auVar57);
  auVar63 = vpaddd_avx2(auVar61,auVar63);
  auVar63 = vpaddd_avx2(auVar63,auVar9);
  auVar9 = vpmulld_avx2(auVar10,auVar42);
  auVar9 = vpaddd_avx2(auVar61,auVar9);
  auVar12 = vpmulld_avx2(auVar62,auVar55);
  auVar9 = vpaddd_avx2(auVar9,auVar12);
  auVar12 = vpmulld_avx2(auVar10,auVar55);
  auVar10 = vpmulld_avx2(auVar62,auVar57);
  auVar10 = vpaddd_avx2(auVar61,auVar10);
  auVar10 = vpaddd_avx2(auVar12,auVar10);
  auVar62 = vpmulld_avx2(auVar64,auVar42);
  auVar62 = vpaddd_avx2(auVar61,auVar62);
  auVar12 = vpmulld_avx2(auVar49,auVar55);
  auVar62 = vpaddd_avx2(auVar12,auVar62);
  auVar64 = vpmulld_avx2(auVar64,auVar55);
  auVar49 = vpmulld_avx2(auVar49,auVar57);
  auVar64 = vpaddd_avx2(auVar61,auVar64);
  auVar64 = vpaddd_avx2(auVar64,auVar49);
  auVar46 = vpmaxsd_avx2(auVar29,auVar46);
  auVar49 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar29,auVar14);
  auVar12 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar29,auVar45);
  auVar14 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar29,auVar60);
  auVar60 = vpminsd_avx2(auVar46,auVar28);
  auVar41 = vpsrad_avx2(auVar47,auVar43);
  auVar42 = vpsrad_avx2(auVar48,auVar43);
  auVar55 = vpsrad_avx2(auVar40,auVar43);
  auVar57 = vpsrad_avx2(auVar63,auVar43);
  auVar21 = vpsrad_avx2(auVar9,auVar43);
  auVar22 = vpsrad_avx2(auVar10,auVar43);
  auVar23 = vpsrad_avx2(auVar62,auVar43);
  auVar24 = vpsrad_avx2(auVar64,auVar43);
  auVar46 = vpaddd_avx2(auVar15,auVar17);
  auVar45 = vpsubd_avx2(auVar17,auVar15);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar9 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar10 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar17,auVar20);
  auVar45 = vpsubd_avx2(auVar17,auVar20);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar62 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar64 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar17,auVar19);
  auVar45 = vpsubd_avx2(auVar17,auVar19);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar15 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  auVar18 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar16,auVar17);
  auVar16 = vpsubd_avx2(auVar17,auVar16);
  auVar45 = vpmulld_avx2(auVar60,auVar54);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  auVar47 = vpmulld_avx2(auVar59,auVar44);
  auVar45 = vpaddd_avx2(auVar47,auVar45);
  auVar47 = vpaddd_avx2(auVar60,auVar59);
  auVar48 = vpmulld_avx2(auVar12,auVar54);
  auVar48 = vpaddd_avx2(auVar61,auVar48);
  auVar40 = vpmulld_avx2(auVar13,auVar44);
  auVar48 = vpaddd_avx2(auVar40,auVar48);
  auVar40 = vpaddd_avx2(auVar12,auVar13);
  auVar63 = vpaddd_avx2(auVar65,auVar50);
  auVar17 = vpsubd_avx2(auVar50,auVar65);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar50 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar16,auVar29);
  auVar65 = vpminsd_avx2(auVar46,auVar28);
  auVar13 = vpsrad_avx2(auVar45,auVar43);
  auVar46 = vpmulld_avx2(auVar47,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar59 = vpsrad_avx2(auVar46,auVar43);
  auVar12 = vpsrad_avx2(auVar48,auVar43);
  auVar46 = vpmulld_avx2(auVar40,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar60 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmaxsd_avx2(auVar63,auVar29);
  local_260 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar51,auVar52);
  auVar48 = vpsubd_avx2(auVar52,auVar51);
  auVar45 = vpmaxsd_avx2(auVar17,auVar29);
  auVar47 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_240 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar23,auVar41);
  auVar40 = vpsubd_avx2(auVar41,auVar23);
  auVar45 = vpmaxsd_avx2(auVar48,auVar29);
  auVar48 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_220 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar21,auVar55);
  auVar63 = vpsubd_avx2(auVar55,auVar21);
  auVar45 = vpmaxsd_avx2(auVar40,auVar29);
  auVar40 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_200 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar11,auVar66);
  auVar52 = vpsubd_avx2(auVar11,auVar66);
  auVar45 = vpmaxsd_avx2(auVar63,auVar29);
  auVar63 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_80 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar58,auVar53);
  auVar51 = vpsubd_avx2(auVar58,auVar53);
  auVar45 = vpmaxsd_avx2(auVar52,auVar29);
  auVar52 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_a0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar24,auVar42);
  auVar66 = vpsubd_avx2(auVar42,auVar24);
  auVar45 = vpmaxsd_avx2(auVar51,auVar29);
  auVar51 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_c0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar22,auVar57);
  auVar53 = vpsubd_avx2(auVar57,auVar22);
  auVar45 = vpmaxsd_avx2(auVar66,auVar29);
  auVar66 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_e0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar9,auVar49);
  auVar49 = vpsubd_avx2(auVar9,auVar49);
  auVar45 = vpmaxsd_avx2(auVar53,auVar29);
  auVar9 = vpminsd_avx2(auVar45,auVar28);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_460 = (__m256i)vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar49,auVar29);
  local_280 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar62,auVar14);
  auVar45 = vpsubd_avx2(auVar62,auVar14);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_440 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_2a0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar59,auVar15);
  auVar45 = vpsubd_avx2(auVar15,auVar59);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_420 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_2c0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar60,auVar50);
  auVar45 = vpsubd_avx2(auVar50,auVar60);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_400 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_2e0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar12,auVar65);
  auVar45 = vpsubd_avx2(auVar65,auVar12);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_3e0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_300 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar13,auVar18);
  auVar45 = vpsubd_avx2(auVar18,auVar13);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_3c0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_320 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar64,auVar56);
  auVar45 = vpsubd_avx2(auVar64,auVar56);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  local_3a0 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpmaxsd_avx2(auVar45,auVar29);
  local_340 = vpminsd_avx2(auVar46,auVar28);
  auVar46 = vpaddd_avx2(auVar10,auVar67);
  auVar45 = vpsubd_avx2(auVar10,auVar67);
  auVar46 = vpmaxsd_avx2(auVar46,auVar29);
  auVar45 = vpmaxsd_avx2(auVar45,auVar29);
  local_380 = vpminsd_avx2(auVar46,auVar28);
  local_360 = vpminsd_avx2(auVar45,auVar28);
  auVar45 = vpmulld_avx2(auVar63,auVar44);
  auVar46 = vpmulld_avx2(auVar9,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar46 = vpaddd_avx2(auVar45,auVar46);
  auVar45 = vpaddd_avx2(auVar9,auVar63);
  local_1e0 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar45,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  local_100 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar40,auVar44);
  auVar45 = vpmulld_avx2(auVar66,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpaddd_avx2(auVar66,auVar40);
  local_1c0 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar45,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  local_120 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar48,auVar44);
  auVar45 = vpmulld_avx2(auVar51,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpaddd_avx2(auVar51,auVar48);
  auVar45 = vpmulld_avx2(auVar45,auVar54);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  local_140 = vpsrad_avx2(auVar45,auVar43);
  local_1a0 = vpsrad_avx2(auVar46,auVar43);
  auVar46 = vpmulld_avx2(auVar47,auVar44);
  auVar45 = vpmulld_avx2(auVar52,auVar54);
  auVar46 = vpaddd_avx2(auVar61,auVar46);
  auVar46 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpaddd_avx2(auVar52,auVar47);
  auVar45 = vpmulld_avx2(auVar45,auVar54);
  auVar45 = vpaddd_avx2(auVar61,auVar45);
  local_180 = vpsrad_avx2(auVar46,auVar43);
  local_160 = vpsrad_avx2(auVar45,auVar43);
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_480,(__m256i *)&local_4a0
                    );
  return;
}

Assistant:

static void idct32_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_avx2(x, cospi, _r, INV_COS_BIT);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_avx2(x, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x);
}